

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O2

int testing::internal::ExecDeathTestChildMain(void *child_arg)

{
  char *__path;
  int iVar1;
  int *piVar2;
  undefined8 extraout_RAX;
  long in_FS_OFFSET;
  int local_128;
  allocator local_121;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    iVar1 = close(*(int *)((long)child_arg + 8));
    if (iVar1 != -1) goto LAB_00186c63;
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  std::__cxx11::string::string((string *)&local_100,"CHECK failed: File ",&local_121);
  std::operator+(&local_e0,&local_100,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/googletest/src/gtest-all.cc"
                );
  std::operator+(&local_c0,&local_e0,", line ");
  local_128 = 0x1d79;
  StreamableToString<int>(&local_120,&local_128);
  std::operator+(&local_a0,&local_c0,&local_120);
  std::operator+(&local_80,&local_a0,": ");
  std::operator+(&local_60,&local_80,"close(args->close_fd)");
  std::operator+(&local_40,&local_60," != -1");
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    DeathTestAbort(&local_40);
LAB_00186c63:
    UnitTest::GetInstance();
    __path = ((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_._M_dataplus.
             _M_p;
    iVar1 = chdir(__path);
    if (iVar1 == 0) {
      execve(**child_arg,*child_arg,_environ);
      std::__cxx11::string::string((string *)&local_e0,"execve(",(allocator *)&local_120);
      std::operator+(&local_c0,&local_e0,(char *)**child_arg);
      std::operator+(&local_a0,&local_c0,", ...) in ");
      std::operator+(&local_80,&local_a0,__path);
      std::operator+(&local_60,&local_80," failed: ");
      GetLastErrnoDescription_abi_cxx11_();
      std::operator+(&local_40,&local_60,&local_100);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_00186f12;
      DeathTestAbort(&local_40);
    }
    std::__cxx11::string::string((string *)&local_a0,"chdir(\"",(allocator *)&local_e0);
    std::operator+(&local_80,&local_a0,__path);
    std::operator+(&local_60,&local_80,"\") failed: ");
    GetLastErrnoDescription_abi_cxx11_();
    std::operator+(&local_40,&local_60,&local_c0);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      DeathTestAbort(&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        _Unwind_Resume(extraout_RAX);
      }
    }
  }
LAB_00186f12:
  __stack_chk_fail();
}

Assistant:

static int ExecDeathTestChildMain(void* child_arg) {
			ExecDeathTestArgs* const args = static_cast<ExecDeathTestArgs*>(child_arg);
			GTEST_DEATH_TEST_CHECK_SYSCALL_(close(args->close_fd));

			// We need to execute the test program in the same environment where
			// it was originally invoked.  Therefore we change to the original
			// working directory first.
			const char* const original_dir =
				UnitTest::GetInstance()->original_working_dir();
			// We can safely call chdir() as it's a direct system call.
			if (chdir(original_dir) != 0) {
				DeathTestAbort(std::string("chdir(\"") + original_dir + "\") failed: " +
					GetLastErrnoDescription());
				return EXIT_FAILURE;
			}

			// We can safely call execve() as it's a direct system call.  We
			// cannot use execvp() as it's a libc function and thus potentially
			// unsafe.  Since execve() doesn't search the PATH, the user must
			// invoke the test program via a valid path that contains at least
			// one path separator.
			execve(args->argv[0], args->argv, GetEnviron());
			DeathTestAbort(std::string("execve(") + args->argv[0] + ", ...) in " +
				original_dir + " failed: " +
				GetLastErrnoDescription());
			return EXIT_FAILURE;
		}